

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_poller.cpp
# Opt level: O3

int __thiscall zmq::socket_poller_t::remove_fd(socket_poller_t *this,fd_t fd_)

{
  pointer __src;
  int *piVar1;
  pointer piVar2;
  pointer __dest;
  
  __dest = (this->_items).
           super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (this->_items).
           super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest == piVar2) {
LAB_001cc329:
    if (__dest != piVar2) {
      __src = __dest + 1;
      if (__src != piVar2) {
        memmove(__dest,__src,(long)piVar2 - (long)__src);
        piVar2 = (this->_items).
                 super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      (this->_items).
      super__Vector_base<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
      ._M_impl.super__Vector_impl_data._M_finish = piVar2 + -1;
      this->_need_rebuild = true;
      return 0;
    }
  }
  else {
    do {
      if ((__dest->socket == (socket_base_t *)0x0) && (__dest->fd == fd_)) goto LAB_001cc329;
      __dest = __dest + 1;
    } while (__dest != piVar2);
  }
  piVar1 = __errno_location();
  *piVar1 = 0x16;
  return -1;
}

Assistant:

int zmq::socket_poller_t::remove_fd (fd_t fd_)
{
    const items_t::iterator it =
      find_if2 (_items.begin (), _items.end (), fd_, &is_fd);

    if (it == _items.end ()) {
        errno = EINVAL;
        return -1;
    }

    _items.erase (it);
    _need_rebuild = true;

    return 0;
}